

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

void __thiscall kj::anon_unknown_9::DiskHandle::zero(DiskHandle *this,uint64_t offset,uint64_t size)

{
  ulong uVar1;
  int iVar2;
  iovec *__iovec;
  iovec *piVar3;
  ulong uVar4;
  size_t elementCount;
  Fault f_1;
  ssize_t n;
  Array<iovec> iov_heap;
  Fault f;
  iovec iov_stack [16];
  Fault local_1b0;
  undefined8 *local_1a8;
  size_t local_1a0;
  iovec *local_198;
  char *local_190;
  iovec *local_188;
  size_t sStack_180;
  undefined8 *local_178;
  DebugComparison<long_&,_int> local_168;
  iovec local_138 [16];
  
  do {
    iVar2 = fallocate64((this->fd).fd,3,offset,size);
    if (-1 < iVar2) {
      return;
    }
    iVar2 = _::Debug::getOsErrorNumber(false);
  } while (iVar2 == -1);
  if (iVar2 == 0) {
    return;
  }
  if (iVar2 != 0x5f) {
    local_168.left = (long *)0x0;
    local_138[0].iov_base = (void *)0x0;
    local_138[0].iov_len = 0;
    _::Debug::Fault::init
              ((Fault *)&local_168,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
              );
    _::Debug::Fault::~Fault((Fault *)&local_168);
    return;
  }
  uVar1 = size + 0xfff;
  uVar4 = uVar1 >> 0xc;
  elementCount = 0x400;
  if (uVar4 < 0x400) {
    elementCount = uVar4;
  }
  if (uVar1 < 0x11000) {
    local_188 = (iovec *)0x0;
    sStack_180 = 0;
    local_178 = (undefined8 *)0x0;
    __iovec = local_138;
    local_1a8 = (undefined8 *)0x0;
    if (uVar1 < 0x1000) goto LAB_001edd1f;
  }
  else {
    __iovec = (iovec *)_::HeapArrayDisposer::allocateImpl
                                 (0x10,elementCount,elementCount,(_func_void_void_ptr *)0x0,
                                  (_func_void_void_ptr *)0x0);
    local_1a8 = &_::HeapArrayDisposer::instance;
    local_178 = &_::HeapArrayDisposer::instance;
    local_188 = __iovec;
    sStack_180 = elementCount;
  }
  piVar3 = __iovec;
  do {
    piVar3->iov_base = "";
    piVar3->iov_len = 0x1000;
    piVar3 = piVar3 + 1;
  } while (piVar3 != __iovec + elementCount);
LAB_001edd1f:
  local_1a0 = sStack_180;
  local_198 = local_188;
  if (size != 0) {
    do {
      if ((size < elementCount << 0xc) && ((size & 0xfff) != 0)) {
        *(uint64_t *)((long)&__iovec->iov_len + (size >> 8 & 0xfffffffffffffff0)) = size & 0xfff;
      }
      do {
        local_190 = (char *)pwritev64((this->fd).fd,__iovec,(int)uVar4,offset);
        if (-1 < (long)local_190) goto LAB_001edd80;
        iVar2 = _::Debug::getOsErrorNumber(false);
      } while (iVar2 == -1);
      if (iVar2 != 0) {
        local_1b0.exception = (Exception *)0x0;
        local_168.left = (long *)0x0;
        local_168.right = 0;
        local_168._12_4_ = 0;
        _::Debug::Fault::init
                  (&local_1b0,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                  );
        _::Debug::Fault::fatal(&local_1b0);
      }
LAB_001edd80:
      local_168.left = (long *)&local_190;
      local_168._8_8_ = local_168._8_8_ & 0xffffffff00000000;
      local_168.op.content.ptr = " > ";
      local_168.op.content.size_ = 4;
      local_168.result = 0 < (long)local_190;
      if ((long)local_190 < 1) {
        _::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<long&,int>&,char_const(&)[24]>
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x1c3,FAILED,"n > 0","_kjCondition,\"pwrite() returned zero?\"",&local_168,
                   (char (*) [24])"pwrite() returned zero?");
        _::Debug::Fault::fatal(&local_1b0);
      }
      offset = offset + (long)local_190;
      size = size - (long)local_190;
    } while (size != 0);
  }
  if (local_198 != (iovec *)0x0) {
    local_188 = (iovec *)0x0;
    sStack_180 = 0;
    (**(code **)*local_1a8)(local_1a8,local_198,0x10,local_1a0,local_1a0,0);
  }
  return;
}

Assistant:

void zero(uint64_t offset, uint64_t size) const {
    // If FALLOC_FL_PUNCH_HOLE is defined, use it to efficiently zero the area.
    //
    // A fallocate() wrapper was only added to Android's Bionic C library as of API level 21,
    // but FALLOC_FL_PUNCH_HOLE is apparently defined in the headers before that, so we'll
    // have to explicitly test for that case.
#if defined(FALLOC_FL_PUNCH_HOLE) && !(__ANDROID__ && __BIONIC__ && __ANDROID_API__ < 21)
    KJ_SYSCALL_HANDLE_ERRORS(
        fallocate(fd, FALLOC_FL_PUNCH_HOLE | FALLOC_FL_KEEP_SIZE, offset, size)) {
      case EOPNOTSUPP:
        // fall back to below
        break;
      default:
        KJ_FAIL_SYSCALL("fallocate(FALLOC_FL_PUNCH_HOLE)", error) { return; }
    } else {
      return;
    }
#endif

    static const byte ZEROS[4096] = { 0 };

#if __APPLE__ || __CYGWIN__ || (defined(__ANDROID__) && __ANDROID_API__ < 24)
    // Mac & Cygwin & Android API levels 23 and lower doesn't have pwritev().
    while (size > sizeof(ZEROS)) {
      write(offset, ZEROS);
      size -= sizeof(ZEROS);
      offset += sizeof(ZEROS);
    }
    write(offset, kj::arrayPtr(ZEROS, size));
#else
    // Use a 4k buffer of zeros amplified by iov to write zeros with as few syscalls as possible.
    size_t count = (size + sizeof(ZEROS) - 1) / sizeof(ZEROS);
    const size_t iovmax = miniposix::iovMax();
    KJ_STACK_ARRAY(struct iovec, iov, kj::min(iovmax, count), 16, 256);

    for (auto& item: iov) {
      item.iov_base = const_cast<byte*>(ZEROS);
      item.iov_len = sizeof(ZEROS);
    }

    while (size > 0) {
      size_t iovCount;
      if (size >= iov.size() * sizeof(ZEROS)) {
        iovCount = iov.size();
      } else {
        iovCount = size / sizeof(ZEROS);
        size_t rem = size % sizeof(ZEROS);
        if (rem > 0) {
          iov[iovCount++].iov_len = rem;
        }
      }

      ssize_t n;
      KJ_SYSCALL(n = pwritev(fd, iov.begin(), count, offset));
      KJ_ASSERT(n > 0, "pwrite() returned zero?");

      offset += n;
      size -= n;
    }
#endif
  }